

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::DeleteProperty_Internal<true>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,PropertyOperationFlags propertyOperationFlags)

{
  Type *pTVar1;
  byte bVar2;
  ScriptContext *this_00;
  RecyclableObject *value;
  code *pcVar3;
  _func_int **pp_Var4;
  bool bVar5;
  ushort uVar6;
  unsigned_short uVar7;
  uint32 index;
  BOOL BVar8;
  undefined4 *puVar9;
  PropertyRecord *pPVar10;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> local_50;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  
  this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  if (propertyId == -1) {
    descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
                 CONCAT44(descriptor._4_4_,0xffffffff);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x406,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar5) goto LAB_00c2ce66;
    *puVar9 = 0;
    propertyId = (PropertyId)descriptor;
  }
  local_48 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_48,
                     (DictionaryPropertyDescriptor<unsigned_short> **)&propertyRecord);
  if (!bVar5) {
    bVar5 = DynamicObject::HasObjectArray(instance);
    if (!bVar5) {
      return 1;
    }
    if (local_48->isNumeric == true) {
      index = PropertyRecord::GetNumericValue(local_48);
      BVar8 = DynamicTypeHandler::DeleteItem
                        (&this->super_DynamicTypeHandler,instance,index,propertyOperationFlags);
      return BVar8;
    }
    return 1;
  }
  bVar5 = DynamicTypeHandler::GetHasSpecialProperties(&this->super_DynamicTypeHandler);
  if (((!bVar5) &&
      (bVar5 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId), bVar5)) &&
     (pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
                 CONCAT44(descriptor._4_4_,propertyId);
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::WriteBarrierSet
              (&local_50,
               &((this_00->super_ScriptContextBase).javascriptLibrary)->
                typesWithNoSpecialPropertyProtoChain);
    propertyId = (PropertyId)descriptor;
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(local_50.ptr);
  }
  bVar5 = DictionaryPropertyDescriptor<unsigned_short>::SanityCheckFixedBits
                    ((DictionaryPropertyDescriptor<unsigned_short> *)propertyRecord);
  if (!bVar5) {
    descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
                 CONCAT44(descriptor._4_4_,propertyId);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x413,"(descriptor->SanityCheckFixedBits())",
                                "descriptor->SanityCheckFixedBits()");
    if (!bVar5) goto LAB_00c2ce66;
    *puVar9 = 0;
    propertyId = (PropertyId)descriptor;
  }
  pp_Var4 = (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject;
  if (((ulong)pp_Var4 & 0x800) == 0) {
    if (((ulong)pp_Var4 & 0x1200) != 0x200) {
      pPVar10 = ScriptContext::GetPropertyName(this_00,propertyId);
      JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                (propertyOperationFlags,this_00,(PCWSTR)(pPVar10 + 1));
      return 0;
    }
    value = (((this_00->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
    if ((((ulong)pp_Var4 & 0x1000) != 0) &&
       (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 2) == 0)) {
      return 0;
    }
    uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                      ((DictionaryPropertyDescriptor<unsigned_short> *)propertyRecord);
    if (uVar6 == 0xffff) {
      if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 4) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)__tls_get_addr(&PTR_013e5f18);
        descriptor->flags = PreventFalseReference;
        descriptor->Attributes = '\0';
        descriptor->Data = 0;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x439,"(descriptor->GetIsAccessor())",
                                    "descriptor->GetIsAccessor()");
        if (!bVar5) goto LAB_00c2ce66;
        descriptor->flags = None;
        descriptor->Attributes = '\0';
        descriptor->Data = 0;
      }
      uVar7 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex
                        ((DictionaryPropertyDescriptor<unsigned_short> *)propertyRecord);
      DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar7,value);
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex
                        ((DictionaryPropertyDescriptor<unsigned_short> *)propertyRecord);
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)uVar6,value);
    if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
      ScriptContext::InvalidateProtoCaches(this_00,propertyId);
    }
    bVar2 = *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject + 1);
    if ((bVar2 & 0x10) == 0) {
      if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 2) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x445,"(!descriptor->GetIsShadowed())",
                                    "!descriptor->GetIsShadowed()");
        if (!bVar5) {
LAB_00c2ce66:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
      *(PropertyAttributes *)
       ((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject + 1) = '\x0e';
    }
    else {
      *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject + 1) = bVar2 & 0xf0 | 0xe;
    }
    InvalidateFixedField<int>
              (this,instance,propertyId,
               (DictionaryPropertyDescriptor<unsigned_short> *)propertyRecord);
    if ((char)((instance->super_RecyclableObject).type.ptr)->flags < '\0') {
      DynamicObject::ChangeType(instance);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,propertyId,(Var)0x0,SideEffects_Any);
  }
  else if (((ulong)pp_Var4 & 0x1000) != 0) {
    JavascriptError::ThrowCantDeleteIfStrictMode
              (propertyOperationFlags,this_00,(PCWSTR)(local_48 + 1));
    return 0;
  }
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::DeleteProperty_Internal(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (!this->GetHasSpecialProperties() && NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
            {
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    scriptContext->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (descriptor->Attributes & PropertyDeleted)
            {
                // If PropertyDeleted and PropertyLetConstGlobal are set then we have both
                // a deleted global property and let/const variable in this descriptor.
                // If allowLetConstGlobal is true then the let/const shadows the property
                // and we should return false for a failed delete by going into the else
                // if branch below.
                if (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
                {
                    JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags, scriptContext, propertyRecord->GetBuffer());

                    return false;
                }
                return true;
            }
            else if (!(descriptor->Attributes & PropertyConfigurable) ||
                (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal)))
            {
                // Let/const properties do not have attributes and they cannot be deleted
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, scriptContext, scriptContext->GetPropertyName(propertyId)->GetBuffer());

                return false;
            }

            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            if (descriptor->HasNonLetConstGlobal())
            {
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetSlotUnchecked(instance, dataSlot, undefined);
                }
                else
                {
                    Assert(descriptor->GetIsAccessor());
                    SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), undefined);
                    SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), undefined);
                }

                if (this->GetFlags() & IsPrototypeFlag)
                {
                    scriptContext->InvalidateProtoCaches(propertyId);
                }

                if ((descriptor->Attributes & PropertyLetConstGlobal) == 0)
                {
                    Assert(!descriptor->GetIsShadowed());
                    descriptor->Attributes = PropertyDeletedDefaults;
                }
                else
                {
                    descriptor->Attributes &= ~PropertyDynamicTypeDefaults;
                    descriptor->Attributes |= PropertyDeletedDefaults;
                }
#if ENABLE_FIXED_FIELDS
                InvalidateFixedField(instance, propertyId, descriptor);
#endif

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);
                return true;
            }

            Assert(descriptor->Attributes & PropertyLetConstGlobal);
            return false;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return DictionaryTypeHandlerBase<T>::DeleteItem(instance, propertyRecord->GetNumericValue(), propertyOperationFlags);
        }

        return true;
    }